

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

unsigned_long __thiscall
el::base::TypedConfigurations::getULong(TypedConfigurations *this,string *confVal)

{
  size_type sVar1;
  char *__nptr;
  ostream *poVar2;
  unsigned_long uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  stringstream internalInfoStream;
  string local_1b0 [32];
  stringstream local_190 [16];
  ostream local_180 [376];
  
  utils::Str::trim((Str *)confVal,confVal);
  sVar1 = confVal->_M_string_length;
  if (sVar1 == 0) goto LAB_0011005b;
  __nptr = (confVal->_M_dataplus)._M_p;
  lVar7 = 0;
  lVar4 = 0;
  for (lVar5 = (long)sVar1 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if ((byte)(__nptr[lVar7 * 4] - 0x3aU) < 0xf6) {
      pcVar6 = __nptr + -lVar4;
      goto LAB_00110052;
    }
    if ((byte)(__nptr[lVar7 * 4 + 1] - 0x3aU) < 0xf6) {
      pcVar6 = __nptr + (1 - lVar4);
      goto LAB_00110052;
    }
    if ((byte)(__nptr[lVar7 * 4 + 2] - 0x3aU) < 0xf6) {
      pcVar6 = __nptr + (2 - lVar4);
      goto LAB_00110052;
    }
    if ((byte)(__nptr[lVar7 * 4 + 3] - 0x3aU) < 0xf6) {
      pcVar6 = __nptr + (3 - lVar4);
      goto LAB_00110052;
    }
    lVar4 = lVar4 + -4;
    lVar7 = lVar7 + 1;
  }
  pcVar6 = __nptr + -lVar4;
  lVar5 = sVar1 + lVar4;
  if (lVar5 == 1) {
LAB_00110046:
    if (0xf5 < (byte)(*pcVar6 - 0x3aU)) {
      pcVar6 = __nptr + sVar1;
    }
  }
  else if (lVar5 == 3) {
    if (0xf5 < (byte)(__nptr[lVar7 * 4] - 0x3aU)) {
      pcVar6 = __nptr + (1 - lVar4);
      goto LAB_00110039;
    }
  }
  else {
    if (lVar5 != 2) goto LAB_00110123;
LAB_00110039:
    if (0xf5 < (byte)(*pcVar6 - 0x3aU)) {
      pcVar6 = pcVar6 + 1;
      goto LAB_00110046;
    }
  }
LAB_00110052:
  if (pcVar6 == __nptr + sVar1) {
LAB_00110123:
    uVar3 = atol(__nptr);
    return uVar3;
  }
LAB_0011005b:
  std::__cxx11::stringstream::stringstream(local_190);
  poVar2 = std::operator<<(local_180,"Configuration value not a valid integer [");
  poVar2 = std::operator<<(poVar2,(string *)confVal);
  std::operator<<(poVar2,"]");
  poVar2 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x67a);
  poVar2 = std::operator<<(poVar2,") [valid");
  poVar2 = std::operator<<(poVar2,"] WITH MESSAGE \"");
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(poVar2,local_1b0);
  poVar2 = std::operator<<(poVar2,"\"");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return 0;
}

Assistant:

unsigned long TypedConfigurations::getULong(std::string confVal) {
  bool valid = true;
  base::utils::Str::trim(confVal);
  valid = !confVal.empty() && std::find_if(confVal.begin(), confVal.end(),
  [](char c) {
    return !base::utils::Str::isDigit(c);
  }) == confVal.end();
  if (!valid) {
    valid = false;
    ELPP_ASSERT(valid, "Configuration value not a valid integer [" << confVal << "]");
    return 0;
  }
  return atol(confVal.c_str());
}